

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_TIME_INFO_Unmarshal(TPMS_TIME_INFO *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  TPM_RC TVar2;
  UINT64 UVar3;
  
  iVar1 = *size;
  *size = iVar1 + -8;
  if (iVar1 < 8) {
    return 0x9a;
  }
  UVar3 = ByteArrayToUint64(*buffer);
  target->time = UVar3;
  *buffer = *buffer + 8;
  TVar2 = TPMS_CLOCK_INFO_Unmarshal(&target->clockInfo,buffer,size);
  return TVar2;
}

Assistant:

TPM_RC
TPMS_TIME_INFO_Unmarshal(TPMS_TIME_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->time), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMS_CLOCK_INFO_Unmarshal((TPMS_CLOCK_INFO *)&(target->clockInfo), buffer, size);
    return result;
}